

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::ConsoleReporter::testCaseEnded(ConsoleReporter *this,TestCaseStats *_testCaseStats)

{
  TablePrinter::close((this->m_tablePrinter)._M_t.
                      super___uniq_ptr_impl<Catch::TablePrinter,_std::default_delete<Catch::TablePrinter>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Catch::TablePrinter_*,_std::default_delete<Catch::TablePrinter>_>
                      .super__Head_base<0UL,_Catch::TablePrinter_*,_false>._M_head_impl,
                      (int)_testCaseStats);
  Option<Catch::TestCaseInfo>::reset
            (&(this->super_StreamingReporterBase<Catch::ConsoleReporter>).currentTestCaseInfo.
              super_Option<Catch::TestCaseInfo>);
  (this->super_StreamingReporterBase<Catch::ConsoleReporter>).currentTestCaseInfo.used = false;
  this->m_headerPrinted = false;
  return;
}

Assistant:

void ConsoleReporter::testCaseEnded(TestCaseStats const& _testCaseStats) {
    m_tablePrinter->close();
    StreamingReporterBase::testCaseEnded(_testCaseStats);
    m_headerPrinted = false;
}